

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  float fVar2;
  ImGuiWindow *this;
  ImDrawList *draw_list;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  ImS8 IVar8;
  ImGuiID id;
  uint uVar9;
  int iVar10;
  ImU32 col;
  ImGuiID close_button_id;
  ImGuiTabItem *pIVar11;
  size_t sVar12;
  char *pcVar13;
  int iVar14;
  int iVar15;
  byte bVar16;
  ImGuiTabItemFlags flags_00;
  ulong uVar17;
  int iVar18;
  ImGuiCol idx;
  undefined7 uVar20;
  undefined8 uVar19;
  int iVar21;
  uint uVar22;
  long lVar23;
  ImGuiTabItem *pIVar24;
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImRect bb;
  bool held;
  bool hovered;
  ImRect local_a8;
  ulong local_90;
  ImVec2 local_88;
  ImGuiContext *local_80;
  uint local_74;
  ImVec2 local_70;
  ImVec2 local_68;
  int local_60;
  int local_5c;
  undefined1 local_58 [24];
  bool *local_40;
  char *local_38;
  
  if (tab_bar->WantLayout == true) {
    TabBarLayout(tab_bar);
  }
  local_80 = GImGui;
  this = GImGui->CurrentWindow;
  if (this->SkipItems != false) {
    return false;
  }
  id = TabBarCalcTabID((ImGuiTabBar *)(ulong)(uint)tab_bar->Flags,label);
  if ((p_open == (bool *)0x0) || (*p_open != false)) {
    local_40 = (bool *)0x0;
    uVar22 = flags;
    if (((uint)flags >> 0x14 & 1) == 0) {
      local_40 = p_open;
      uVar22 = flags | 0x100000;
    }
    if (p_open != (bool *)0x0) {
      uVar22 = flags;
    }
    IVar3 = TabItemCalcSize(label,local_40 != (bool *)0x0);
    fVar25 = IVar3.x;
    uVar9 = (tab_bar->Tabs).Size;
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._0_4_ = IVar3.x;
    local_58._4_4_ = IVar3.y;
    local_58._12_4_ = extraout_XMM0_Dd;
    local_38 = label;
    if (0 < (int)uVar9 && id != 0) {
      pIVar11 = (tab_bar->Tabs).Data;
      lVar23 = 0;
      do {
        if (*(ImU32 *)((long)&pIVar11->ID + lVar23) == id) {
          pIVar24 = (ImGuiTabItem *)((long)&pIVar11->ID + lVar23);
          local_88 = (ImVec2)((ulong)local_88 & 0xffffffff00000000);
          goto LAB_0019168b;
        }
        lVar23 = lVar23 + 0x20;
      } while ((ulong)uVar9 << 5 != lVar23);
    }
    if (uVar9 == (tab_bar->Tabs).Capacity) {
      if (uVar9 == 0) {
        iVar14 = 8;
      }
      else {
        iVar14 = (int)uVar9 / 2 + uVar9;
      }
      iVar18 = uVar9 + 1;
      if ((int)(uVar9 + 1) < iVar14) {
        iVar18 = iVar14;
      }
      pIVar11 = (ImGuiTabItem *)MemAlloc((long)iVar18 << 5);
      pIVar24 = (tab_bar->Tabs).Data;
      if (pIVar24 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar11,pIVar24,(long)(tab_bar->Tabs).Size << 5);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar11;
      (tab_bar->Tabs).Capacity = iVar18;
      uVar9 = (tab_bar->Tabs).Size;
      fVar25 = (float)local_58._0_4_;
    }
    else {
      pIVar11 = (tab_bar->Tabs).Data;
    }
    pIVar24 = pIVar11 + (int)uVar9;
    pIVar24->ID = 0;
    pIVar24->Flags = 0;
    pIVar24->LastFrameVisible = -1;
    pIVar24->LastFrameSelected = -1;
    pIVar11[(int)uVar9].NameOffset = -1;
    pIVar11[(int)uVar9].Offset = 0.0;
    pIVar11[(int)uVar9].Width = 0.0;
    pIVar11[(int)uVar9].ContentWidth = 0.0;
    iVar14 = (tab_bar->Tabs).Size;
    uVar9 = iVar14 + 1;
    (tab_bar->Tabs).Size = uVar9;
    if (iVar14 < 0) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x538,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
    }
    pIVar11 = (tab_bar->Tabs).Data;
    uVar17 = (ulong)uVar9;
    pIVar24 = pIVar11 + (uVar17 - 1);
    pIVar24->ID = id;
    pIVar11[uVar17 - 1].Width = fVar25;
    local_88.x = (float)(int)CONCAT71((int7)(uVar17 * 0x20 >> 8),1);
LAB_0019168b:
    pcVar5 = local_38;
    local_90 = CONCAT44(local_90._4_4_,id);
    if ((pIVar24 < pIVar11) || (pIVar11 + (int)uVar9 <= pIVar24)) {
      __assert_fail("it >= Data && it < Data + Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x54f,
                    "int ImVector<ImGuiTabItem>::index_from_ptr(const T *) const [T = ImGuiTabItem]"
                   );
    }
    tab_bar->LastTabItemIdx = (short)((uint)((int)pIVar24 - (int)pIVar11) >> 5);
    pIVar24->ContentWidth = fVar25;
    local_74 = tab_bar->Flags;
    iVar15 = tab_bar->PrevFrameVisible + 1;
    iVar14 = local_80->FrameCount;
    iVar21 = pIVar24->LastFrameVisible + 1;
    pIVar24->LastFrameVisible = iVar14;
    pIVar24->Flags = uVar22;
    iVar18 = (tab_bar->TabsNames).Buf.Size;
    iVar10 = iVar18 + -1;
    if (iVar18 == 0) {
      iVar10 = 0;
    }
    pIVar24->NameOffset = iVar10;
    sVar12 = strlen(local_38);
    ImGuiTextBuffer::append(&tab_bar->TabsNames,pcVar5,pcVar5 + sVar12 + 1);
    pIVar4 = local_80;
    uVar17 = local_90;
    uVar9 = tab_bar->Flags;
    bVar16 = iVar21 < iVar14;
    id = (ImGuiID)local_90;
    if (iVar21 < iVar14) {
      if ((((uVar9 & 2) != 0) && (tab_bar->NextSelectedTabId == 0)) &&
         ((iVar14 <= iVar15 || (tab_bar->SelectedTabId == 0)))) {
        tab_bar->NextSelectedTabId = (ImGuiID)local_90;
      }
    }
    else if ((uVar9 & 1) == 0) {
      fVar25 = tab_bar->OffsetNextTab;
      pIVar24->Offset = fVar25;
      tab_bar->OffsetNextTab = pIVar24->Width + (local_80->Style).ItemInnerSpacing.x + fVar25;
    }
    if (((uVar22 & 2) != 0) && (tab_bar->SelectedTabId != (ImGuiID)local_90)) {
      tab_bar->NextSelectedTabId = (ImGuiID)local_90;
    }
    uVar20 = (undefined7)((ulong)&tab_bar->TabsNames >> 8);
    if (tab_bar->VisibleTabId == (ImGuiID)local_90) {
      tab_bar->VisibleTabWasSubmitted = true;
      uVar19 = CONCAT71(uVar20,1);
    }
    else if ((tab_bar->SelectedTabId == 0 && iVar15 < iVar14) && ((tab_bar->Tabs).Size == 1)) {
      uVar19 = CONCAT71(uVar20,(uVar9 & 2) == 0);
    }
    else {
      uVar19 = 0;
    }
    if (((local_88.x._0_1_ | iVar14 <= iVar15) & iVar21 < iVar14) != 1) {
      if (tab_bar->SelectedTabId == (ImGuiID)local_90) {
        pIVar24->LastFrameSelected = local_80->FrameCount;
      }
      local_88 = (this->DC).CursorPos;
      local_a8.Max.x = pIVar24->Width;
      IVar3 = (tab_bar->BarRect).Min;
      local_a8.Min.x = (float)(int)(pIVar24->Offset - tab_bar->ScrollingAnim) + IVar3.x;
      local_a8.Min.y = IVar3.y + 0.0;
      IVar3.y = local_a8.Min.y;
      IVar3.x = local_a8.Min.x;
      (this->DC).CursorPos = IVar3;
      local_a8.Max.x = local_a8.Max.x + local_a8.Min.x;
      local_a8.Max.y = (float)local_58._4_4_ + local_a8.Min.y;
      fVar25 = (tab_bar->BarRect).Min.x;
      fVar2 = (tab_bar->BarRect).Max.x;
      uVar9 = -(uint)(local_a8.Min.x < fVar25 || fVar2 < local_a8.Max.x);
      local_58._0_4_ = uVar9;
      local_90 = uVar19;
      local_60 = iVar21;
      local_5c = iVar14;
      if ((uVar9 & 1) != 0) {
        local_68.y = local_a8.Min.y + -1.0;
        local_68.x = (float)(~-(uint)(fVar25 <= local_a8.Min.x) & (uint)fVar25 |
                            -(uint)(fVar25 <= local_a8.Min.x) & (uint)local_a8.Min.x);
        local_70.x = fVar2;
        local_70.y = local_a8.Max.y;
        PushClipRect(&local_68,&local_70,true);
      }
      local_68.x = local_a8.Max.x - local_a8.Min.x;
      local_68.y = local_a8.Max.y - local_a8.Min.y;
      IVar3 = (this->DC).CursorMaxPos;
      ItemSize(&local_68,(pIVar4->Style).FramePadding.y);
      (this->DC).CursorMaxPos = IVar3;
      bVar6 = ItemAdd(&local_a8,id,(ImRect *)0x0);
      if (!bVar6) {
        if ((local_58._0_16_ & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          PopClipRect();
        }
        (this->DC).CursorPos = local_88;
        return (bool)(char)local_90;
      }
      bVar6 = ButtonBehavior(&local_a8,id,(bool *)&local_68,(bool *)&local_70,
                             (uint)pIVar4->DragDropActive << 6 | 0x102);
      if (bVar6) {
        tab_bar->NextSelectedTabId = id;
      }
      local_68.x._0_1_ = local_68.x._0_1_ | pIVar4->HoveredId == id;
      bVar6 = SUB81(local_90,0);
      if (local_70.x._0_1_ == '\0') {
        bVar7 = local_60 < local_5c;
        SetItemAllowOverlap();
        bVar16 = local_70.x._0_1_ ^ 1 | bVar7;
      }
      pcVar5 = local_38;
      if (((((bVar16 & 1) == 0) && (bVar7 = IsMouseDragging(0,-1.0), bVar7)) &&
          (pIVar4->DragDropActive == false)) && ((tab_bar->Flags & 1) != 0)) {
        fVar25 = (pIVar4->IO).MouseDelta.x;
        if ((0.0 <= fVar25) ||
           (pIVar1 = &(pIVar4->IO).MousePos,
           local_a8.Min.x < pIVar1->x || local_a8.Min.x == pIVar1->x)) {
          if ((fVar25 <= 0.0) || ((pIVar4->IO).MousePos.x <= local_a8.Max.x)) goto LAB_00191a7e;
          IVar8 = '\x01';
        }
        else {
          IVar8 = -1;
        }
        if (tab_bar->ReorderRequestTabId != 0) {
          __assert_fail("tab_bar->ReorderRequestTabId == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                        ,0x1b12,
                        "void ImGui::TabBarQueueChangeTabOrder(ImGuiTabBar *, const ImGuiTabItem *, int)"
                       );
        }
        tab_bar->ReorderRequestTabId = pIVar24->ID;
        tab_bar->ReorderRequestDir = IVar8;
      }
LAB_00191a7e:
      draw_list = this->DrawList;
      idx = 0x22;
      if ((local_70.x._0_1_ == '\0') && (local_68.x._0_1_ == '\0')) {
        if (bVar6 == false) {
          idx = (uint)((local_74 >> 0x15 & 1) == 0) * 3 + 0x21;
        }
        else {
          idx = (uint)((local_74 >> 0x15 & 1) == 0) * 2 + 0x23;
        }
      }
      col = GetColorU32(idx,1.0);
      TabItemBackground(draw_list,&local_a8,flags_00,col);
      RenderNavHighlight(&local_a8,id,1);
      bVar7 = IsItemHovered(8);
      if ((bVar7) &&
         ((bVar7 = IsMouseClicked(1,false), bVar7 || (bVar7 = IsMouseReleased(1), bVar7)))) {
        tab_bar->NextSelectedTabId = id;
      }
      uVar22 = (uint)tab_bar->Flags >> 1 & 4 | uVar22;
      if (local_40 == (bool *)0x0) {
        TabItemLabelAndCloseButton
                  (draw_list,&local_a8,uVar22,tab_bar->FramePadding,pcVar5,id,0,bVar6);
      }
      else {
        close_button_id = ImGuiWindow::GetID(this,(void *)((uVar17 & 0xffffffff) + 1));
        bVar7 = TabItemLabelAndCloseButton
                          (draw_list,&local_a8,uVar22,tab_bar->FramePadding,pcVar5,id,
                           close_button_id,bVar6);
        if (bVar7) {
          *local_40 = false;
          if (tab_bar->VisibleTabId == pIVar24->ID) {
            if ((pIVar24->Flags & 1U) == 0) {
              pIVar24->LastFrameVisible = -1;
              tab_bar->SelectedTabId = 0;
              tab_bar->NextSelectedTabId = 0;
            }
          }
          else if ((pIVar24->Flags & 1U) != 0) {
            tab_bar->NextSelectedTabId = pIVar24->ID;
          }
        }
      }
      pIVar4 = local_80;
      if ((local_58._0_16_ & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        PopClipRect();
      }
      (this->DC).CursorPos = local_88;
      if (pIVar4->HoveredId != id) {
        return bVar6;
      }
      if (local_70.x._0_1_ != '\0') {
        return bVar6;
      }
      if (pIVar4->HoveredIdNotActiveTimer <= 0.5) {
        return bVar6;
      }
      bVar7 = IsItemHovered(0);
      if (!bVar7) {
        return bVar6;
      }
      if ((tab_bar->Flags & 0x20) != 0) {
        return bVar6;
      }
      pcVar13 = FindRenderedTextEnd(pcVar5,(char *)0x0);
      SetTooltip("%.*s",(ulong)(uint)((int)pcVar13 - (int)pcVar5),pcVar5);
      return bVar6;
    }
    PushItemFlag(0x18,true);
  }
  else {
    PushItemFlag(0x18,true);
    uVar19 = 0;
  }
  local_a8.Max.x = 0.0;
  local_a8.Max.y = 0.0;
  local_a8.Min.x = 0.0;
  local_a8.Min.y = 0.0;
  ItemAdd(&local_a8,id,(ImRect *)0x0);
  PopItemFlag();
  return SUB81(uVar19,0);
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    if (tab_appearing && !(tab_bar_appearing && !tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}